

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom64.cc
# Opt level: O2

int test_atom64(hwtest_ctx *ctx)

{
  unsigned_short *__xsubi;
  undefined8 uVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  nva_card **ppnVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  uint uVar17;
  uint local_3064;
  ulong local_3060;
  uint64_t src1 [512];
  uint64_t src3 [512];
  uint64_t src2 [512];
  
  __xsubi = ctx->rand48;
  iVar8 = 0;
  do {
    if (iVar8 == 100000) {
      return 1;
    }
    lVar10 = jrand48(__xsubi);
    uVar17 = (uint)lVar10 & 0xfff0000 | 0xd0000011;
    local_3060 = (ulong)uVar17;
    uVar11 = jrand48(__xsubi);
    uVar6 = (uint)uVar11;
    local_3064 = uVar6 & 0x3f1ff03c | 0xc08007c0;
    lVar10 = jrand48(__xsubi);
    uVar7 = (uint)(uVar11 >> 2) & 0xf;
    if ((uVar6 >> 0x1d & 1) == 0) {
      if (uVar7 != 2) {
LAB_002767bc:
        if (uVar7 != 3) goto LAB_002767cd;
      }
    }
    else {
      local_3060 = (ulong)(uVar17 & 0xdf800001 | 0x40020);
      if (uVar7 != 2) goto LAB_002767bc;
      local_3064 = uVar6 & 0x3f00303c | 0xc08187c0;
LAB_002767cd:
      iVar9 = g80_gr_mthd(ctx,3,0x3a8,0x40);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x3ac,0x10200);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x3b0,1);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x2c0,10);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x2b4,0x10200);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x2b8,1);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x3b8,2);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x2f8,1);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x388,0);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x3a4,0x10001);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x374,0);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,900,0x100);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_mthd(ctx,3,0x37c,((uint)lVar10 & 2) << 0xf | (uint)lVar10 & 1);
      ppnVar5 = nva_cards;
      if (iVar9 != 0) {
        return 3;
      }
      src1[0] = 0xc410078030030001;
      src1[1] = 0x10320008005;
      src1[2] = 0x20320008009;
      src1[3] = 0x3032000800d;
      src1[4] = 0x3100f8011;
      src1[5] = 0xa000078000000801;
      src1[6] = 0x80800780d0000211;
      src1[7] = 0x80800780d0000419;
      src1[8]._0_4_ = (int)local_3060;
      src1[8]._4_4_ = local_3064;
      src1[9] = 0xa0800780d0000421;
      src1[10] = 0x200007800000001d;
      src1[0xb] = 0xa0c00780d000021d;
      src1[0xc] = 0xe0000781f0000001;
      *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x100;
      for (lVar10 = 0; lVar10 != 0x1a; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 * 4 + 0x730000) =
             *(undefined4 *)((long)src1 + lVar10 * 4);
      }
      *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
      do {
      } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
      iVar9 = g80_gr_mthd(ctx,3,0x380,0);
      if (iVar9 != 0) {
        return 3;
      }
      uVar11 = jrand48(__xsubi);
      for (lVar10 = 0; ppnVar5 = nva_cards, lVar10 != 0x200; lVar10 = lVar10 + 1) {
        uVar12 = jrand48(__xsubi);
        lVar13 = jrand48(__xsubi);
        src1[lVar10] = lVar13 << 0x20 | uVar12 & 0xffffffff;
        uVar14 = jrand48(__xsubi);
        lVar13 = jrand48(__xsubi);
        src2[lVar10] = lVar13 << 0x20 | uVar14 & 0xffffffff;
        uVar15 = jrand48(__xsubi);
        lVar13 = jrand48(__xsubi);
        src3[lVar10] = lVar13 << 0x20 | uVar15 & 0xffffffff;
        if ((uVar11 & 1) != 0) {
          src1[lVar10] = (long)(char)uVar12;
        }
        if ((uVar11 & 2) != 0) {
          src2[lVar10] = (long)(char)uVar14;
        }
        if ((uVar11 & 4) != 0) {
          src3[lVar10] = (long)(char)uVar15;
        }
      }
      *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x200;
      for (lVar10 = 0; lVar10 != 0x1000; lVar10 = lVar10 + 8) {
        uVar1 = *(undefined8 *)((long)src1 + lVar10);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x700000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x700004) = (int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)src2 + lVar10);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x701000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x701004) = (int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)src3 + lVar10);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x702000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar10 + 0x702004) = (int)((ulong)uVar1 >> 0x20);
      }
      *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
      do {
      } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
      iVar9 = g80_gr_mthd(ctx,3,0x368,0);
      if (iVar9 != 0) {
        return 3;
      }
      iVar9 = g80_gr_idle(ctx);
      if (iVar9 != 0) {
        return 3;
      }
      pvVar2 = nva_cards[ctx->cnum]->bar0;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 1) {
        uVar3 = src1[lVar10];
        uVar4 = src2[lVar10];
        uVar16 = uVar4;
        switch(local_3064 >> 2 & 0xf) {
        case 0:
          uVar16 = uVar4 + uVar3;
          break;
        case 1:
          break;
        case 2:
          uVar16 = uVar3;
          if (uVar3 == uVar4) {
            uVar16 = src3[lVar10];
          }
          break;
        case 3:
          abort();
        default:
          uVar16 = uVar3;
        }
        if (((*(int *)((long)pvVar2 + lVar10 * 8 + 0x701000) != 0xf) ||
            (CONCAT44(*(undefined4 *)((long)pvVar2 + lVar10 * 8 + 0x700004),
                      *(undefined4 *)((long)pvVar2 + lVar10 * 8 + 0x700000)) != uVar16)) ||
           (0xdfffffff < local_3064 &&
            CONCAT44(*(undefined4 *)((long)pvVar2 + lVar10 * 8 + 0x702004),
                     *(undefined4 *)((long)pvVar2 + lVar10 * 8 + 0x702000)) != uVar3)) {
          printf("atom64 %08x %08x (%016lx %016lx %016lx %016lx)[%d]: got %016lx.%x %016lx expected %016lx.%x %016lx\n"
                 ,local_3060,(ulong)local_3064);
          return 3;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

static int test_atom64(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000011 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc08007c0 | (jrand48(ctx->rand48) & 0x3f1ff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x040020;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom64_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom64_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint64_t src1[0x200], src2[0x200], src3[0x200];
		atom64_gen(ctx, src1, src2, src3);
		if (atom64_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}